

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

void Res_SimCountResults(Res_Sim_t *p,int *pnDcs,int *pnOnes,int *pnZeros,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  int *piVar10;
  double dVar11;
  
  pVVar5 = p->pAig->vPos;
  iVar1 = pVVar5->nSize;
  if (0 < iVar1) {
    ppvVar6 = pVVar5->pArray;
    iVar2 = *(int *)((long)*ppvVar6 + 0x10);
    if (-1 < (long)iVar2) {
      uVar3 = p->vPats->nSize;
      if ((iVar2 < (int)uVar3) && (iVar1 != 1)) {
        uVar4 = *(uint *)((long)ppvVar6[1] + 0x10);
        if ((-1 < (long)(int)uVar4) && (uVar4 < uVar3)) {
          if (0 < p->nBytesIn) {
            ppvVar6 = p->vPats->pArray;
            pvVar7 = ppvVar6[iVar2];
            pvVar8 = ppvVar6[(int)uVar4];
            lVar9 = 0;
            do {
              piVar10 = pnDcs;
              if ((*(char *)((long)pvVar7 + lVar9) != '\0') &&
                 (piVar10 = pnZeros, *(char *)((long)pvVar8 + lVar9) != '\0')) {
                piVar10 = pnOnes;
              }
              *piVar10 = *piVar10 + 1;
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nBytesIn);
          }
          if (fVerbose != 0) {
            dVar11 = (double)(*pnZeros + *pnDcs + *pnOnes);
            printf("Dc = %7.2f %%  ",((double)*pnDcs * 100.0) / dVar11);
            printf("On = %7.2f %%  ",((double)*pnOnes * 100.0) / dVar11);
            printf("Off = %7.2f %%  ",((double)*pnZeros * 100.0) / dVar11);
            return;
          }
          return;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimCountResults( Res_Sim_t * p, int * pnDcs, int * pnOnes, int * pnZeros, int fVerbose )
{
    unsigned char * pInfoCare, * pInfoNode;
    int i, nTotal = 0;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        if ( !pInfoCare[i] )
            (*pnDcs)++;
        else if ( !pInfoNode[i] )
            (*pnZeros)++;
        else
            (*pnOnes)++;
    }
    nTotal += *pnDcs;
    nTotal += *pnZeros;
    nTotal += *pnOnes;
    if ( fVerbose )
    {
        printf( "Dc = %7.2f %%  ",  100.0*(*pnDcs)  /nTotal );
        printf( "On = %7.2f %%  ",  100.0*(*pnOnes) /nTotal );
        printf( "Off = %7.2f %%  ", 100.0*(*pnZeros)/nTotal );
    }
}